

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_string_view.pb.cc
# Opt level: O1

void proto2_unittest::TestStringView::SharedDtor(MessageLite *self)

{
  ulong uVar1;
  
  if (((self->_internal_metadata_).ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadata::
    DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(&self->_internal_metadata_);
  }
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    google::protobuf::internal::ArenaStringPtr::Destroy
              ((ArenaStringPtr *)&self[4]._internal_metadata_);
    google::protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 5));
    google::protobuf::internal::ArenaStringPtr::Destroy
              ((ArenaStringPtr *)&self[5]._internal_metadata_);
    google::protobuf::
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)(self + 3));
    google::protobuf::
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&self[1]._internal_metadata_);
    return;
  }
  SharedDtor((TestStringView *)&stack0xffffffffffffffe0);
}

Assistant:

inline void TestStringView::SharedDtor(MessageLite& self) {
  TestStringView& this_ = static_cast<TestStringView&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.singular_string_.Destroy();
  this_._impl_.singular_bytes_.Destroy();
  this_._impl_.implicit_presence_.Destroy();
  this_._impl_.~Impl_();
}